

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O1

Storyboard * __thiscall ApprovalTests::Storyboard::addFrame(Storyboard *this,string *frame)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  size_type *psVar5;
  ulong uVar6;
  _Alloc_hider _Var7;
  uint __len;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  uVar1 = this->frameCount_;
  if (uVar1 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Initial Frame","");
    addFrame(this,&local_70,frame);
    _Var7._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return this;
    }
  }
  else {
    __val = -uVar1;
    if (0 < (int)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar6 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar4 = (uint)uVar6;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_0017a839;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_0017a839;
        }
        if (uVar4 < 10000) goto LAB_0017a839;
        uVar6 = uVar6 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_0017a839:
    local_50[0] = &local_40;
    ::std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar1 >> 0x1f));
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50[0]->_M_local_buf + (uVar1 >> 0x1f),__len,__val);
    plVar3 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x19ecfe);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70.field_2._8_8_ = plVar3[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar5;
      local_70._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_70._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    addFrame(this,&local_70,frame);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    _Var7._M_p = (pointer)local_50[0];
    if (local_50[0] == &local_40) {
      return this;
    }
  }
  operator_delete(_Var7._M_p);
  return this;
}

Assistant:

Storyboard& Storyboard::addFrame(const std::string& frame)
    {
        if (frameCount_ == 0)
        {
            return addFrame("Initial Frame", frame);
        }
        else
        {
            return addFrame("Frame #" + std::to_string(frameCount_), frame);
        }
    }